

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::DelayedSequenceElementSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,DelayedSequenceElementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  SyntaxNode *node;
  size_t index_local;
  DelayedSequenceElementSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->doubleHash).kind;
    token._2_1_ = (this->doubleHash).field_0x2;
    token.numFlags.raw = (this->doubleHash).numFlags.raw;
    token.rawLen = (this->doubleHash).rawLen;
    token.info = (this->doubleHash).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->delayVal->super_SyntaxNode);
    break;
  case 2:
    token_00.kind = (this->openBracket).kind;
    token_00._2_1_ = (this->openBracket).field_0x2;
    token_00.numFlags.raw = (this->openBracket).numFlags.raw;
    token_00.rawLen = (this->openBracket).rawLen;
    token_00.info = (this->openBracket).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    token_01.kind = (this->op).kind;
    token_01._2_1_ = (this->op).field_0x2;
    token_01.numFlags.raw = (this->op).numFlags.raw;
    token_01.rawLen = (this->op).rawLen;
    token_01.info = (this->op).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->range->super_SyntaxNode);
    break;
  case 5:
    token_02.kind = (this->closeBracket).kind;
    token_02._2_1_ = (this->closeBracket).field_0x2;
    token_02.numFlags.raw = (this->closeBracket).numFlags.raw;
    token_02.rawLen = (this->closeBracket).rawLen;
    token_02.info = (this->closeBracket).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 6:
    node = &not_null<slang::syntax::SequenceExprSyntax_*>::get(&this->expr)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax DelayedSequenceElementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return doubleHash;
        case 1: return delayVal;
        case 2: return openBracket;
        case 3: return op;
        case 4: return range;
        case 5: return closeBracket;
        case 6: return expr.get();
        default: return nullptr;
    }
}